

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O0

void __thiscall
HEkkPrimal::hyperChooseColumnChangedInfeasibility
          (HEkkPrimal *this,double infeasibility,HighsInt iCol)

{
  double dVar1;
  reference pvVar2;
  double *pdVar3;
  int in_ESI;
  long in_RDI;
  double in_XMM0_Qa;
  
  dVar1 = *(double *)(in_RDI + 0x1e8);
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xc0),(long)in_ESI);
  if (in_XMM0_Qa * in_XMM0_Qa <= dVar1 * *pvVar2) {
    dVar1 = *(double *)(in_RDI + 0x1e0);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xc0),(long)in_ESI);
    if (dVar1 * *pvVar2 < in_XMM0_Qa * in_XMM0_Qa) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xc0),(long)in_ESI);
      *(double *)(in_RDI + 0x1e0) = (in_XMM0_Qa * in_XMM0_Qa) / *pvVar2;
    }
  }
  else {
    pdVar3 = std::max<double>((double *)(in_RDI + 0x1e8),(double *)(in_RDI + 0x1e0));
    *(double *)(in_RDI + 0x1e0) = *pdVar3;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xc0),(long)in_ESI);
    *(double *)(in_RDI + 0x1e8) = (in_XMM0_Qa * in_XMM0_Qa) / *pvVar2;
    *(int *)(in_RDI + 0x1f0) = in_ESI;
  }
  return;
}

Assistant:

void HEkkPrimal::hyperChooseColumnChangedInfeasibility(
    const double infeasibility, const HighsInt iCol) {
  if (infeasibility * infeasibility >
      max_changed_measure_value * edge_weight_[iCol]) {
    max_hyper_chuzc_non_candidate_measure =
        max(max_changed_measure_value, max_hyper_chuzc_non_candidate_measure);
    max_changed_measure_value =
        infeasibility * infeasibility / edge_weight_[iCol];
    max_changed_measure_column = iCol;
  } else if (infeasibility * infeasibility >
             max_hyper_chuzc_non_candidate_measure * edge_weight_[iCol]) {
    max_hyper_chuzc_non_candidate_measure =
        infeasibility * infeasibility / edge_weight_[iCol];
  }
}